

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValInt64
          (ValidationState_t *this,uint32_t id,int64_t *val)

{
  uint16_t uVar1;
  pointer puVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  long lVar5;
  
  pIVar3 = FindDef(this,id);
  if (pIVar3 == (Instruction *)0x0) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x581,
                  "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                 );
  }
  pIVar4 = FindDef(this,(pIVar3->inst_).type_id);
  if ((pIVar4 == (Instruction *)0x0) || ((pIVar4->inst_).opcode != 0x15)) {
    lVar5 = 0;
  }
  else {
    uVar1 = (pIVar3->inst_).opcode;
    lVar5 = 0;
    if (uVar1 != 0x2e) {
      if (uVar1 != 0x2b) goto LAB_001b18d7;
      puVar2 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
      if (lVar5 == 5) {
        lVar5 = *(long *)(puVar2 + 3);
      }
      else {
        if (lVar5 != 4) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x590,
                        "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                       );
        }
        lVar5 = (long)(int)puVar2[3];
      }
    }
    *val = lVar5;
    lVar5 = 1;
  }
LAB_001b18d7:
  return SUB81(lVar5,0);
}

Assistant:

bool ValidationState_t::EvalConstantValInt64(uint32_t id, int64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = int32_t(inst->word(3));
  } else {
    assert(inst->words().size() == 5);
    const uint32_t lo_word = inst->word(3);
    const uint32_t hi_word = inst->word(4);
    *val = static_cast<int64_t>(uint64_t(lo_word) | uint64_t(hi_word) << 32);
  }
  return true;
}